

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall PDA::Transducer::Preprocessor::Preprocessor(Preprocessor *this,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long *plVar2;
  pointer pcVar3;
  char cVar4;
  wchar_t wVar5;
  NotFoundException *this_00;
  wstring line;
  wifstream inputFile;
  wstring local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_240;
  long local_238 [4];
  byte abStack_218 [208];
  long alStack_148 [35];
  
  local_240 = &(this->m_source).field_2;
  (this->m_source)._M_dataplus._M_p = (pointer)local_240;
  (this->m_source)._M_string_length = 0;
  (this->m_source).field_2._M_local_buf[0] = L'\0';
  local_248 = &(this->m_currentFileName).field_2;
  (this->m_currentFileName)._M_dataplus._M_p = (pointer)local_248;
  (this->m_currentFileName)._M_string_length = 0;
  (this->m_currentFileName).field_2._M_local_buf[0] = '\0';
  this->m_lineIndex = 0;
  std::__cxx11::string::_M_assign((string *)&this->m_currentFileName);
  std::wifstream::wifstream(local_238,(string *)&this->m_currentFileName,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    this_00 = (NotFoundException *)__cxa_allocate_exception(0x28);
    pcVar3 = (fileName->_M_dataplus)._M_p;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::wstring::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((wstring *)&local_268,pcVar3,pcVar3 + fileName->_M_string_length);
    Exception::NotFoundException::NotFoundException(this_00,&local_268);
    __cxa_throw(this_00,&Exception::NotFoundException::typeinfo,Exception::Exception::~Exception);
  }
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    paVar1 = &local_268.field_2;
    do {
      local_268._M_string_length = 0;
      local_268.field_2._M_local_buf[0] = L'\0';
      plVar2 = *(long **)((long)alStack_148 + *(long *)(local_238[0] + -0x18));
      local_268._M_dataplus._M_p = (pointer)paVar1;
      if (plVar2 == (long *)0x0) {
        std::__throw_bad_cast();
      }
      wVar5 = (**(code **)(*plVar2 + 0x50))(plVar2,10);
      std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((wistream *)local_238,(wstring *)&local_268,wVar5);
      std::__cxx11::wstring::_M_append((wchar_t *)this,(ulong)local_268._M_dataplus._M_p);
      std::__cxx11::wstring::append((wchar_t *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT44(local_268.field_2._M_local_buf[1],local_268.field_2._M_local_buf[0]
                                ) * 4 + 4);
      }
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0);
  }
  execute(this);
  std::wifstream::~wifstream(local_238);
  return;
}

Assistant:

Preprocessor::Preprocessor(const std::string &fileName) : m_lineIndex(0)
{
    m_currentFileName = fileName;
    std::wifstream inputFile(m_currentFileName);
    if (inputFile.is_open())
    {
        while(inputFile)
        {
            std::wstring line;
            std::getline(inputFile, line);
            m_source.append(line);
            m_source.append(L"\r\n");
        }
    }
    else
    {
        throw PDA::Exception::NotFoundException(std::wstring(fileName.begin(), fileName.end()));
    }
    execute();
}